

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iconify.c
# Opt level: O1

void window_refresh_callback(GLFWwindow *window)

{
  int height;
  int width;
  int local_20;
  int local_1c;
  
  glfwGetTime();
  printf("%0.2f Window refresh\n");
  glfwGetFramebufferSize(window,&local_1c,&local_20);
  glfwMakeContextCurrent(window);
  glEnable(0xc11);
  glScissor(0,0,local_1c,local_20);
  glClearColor(0,0,0,0);
  glClear(0x4000);
  glScissor(0,0,0x280,0x1e0);
  glClearColor(0x3f800000,0x3f800000,0x3f800000,0);
  glClear(0x4000);
  glfwSwapBuffers(window);
  return;
}

Assistant:

static void window_refresh_callback(GLFWwindow* window)
{
    int width, height;

    printf("%0.2f Window refresh\n", glfwGetTime());

    glfwGetFramebufferSize(window, &width, &height);

    glfwMakeContextCurrent(window);

    glEnable(GL_SCISSOR_TEST);

    glScissor(0, 0, width, height);
    glClearColor(0, 0, 0, 0);
    glClear(GL_COLOR_BUFFER_BIT);

    glScissor(0, 0, 640, 480);
    glClearColor(1, 1, 1, 0);
    glClear(GL_COLOR_BUFFER_BIT);

    glfwSwapBuffers(window);
}